

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpus.c
# Opt level: O0

int64_t cpu_icount_to_ns_x86_64(int64_t icount)

{
  int64_t icount_local;
  
  return icount << 3;
}

Assistant:

int64_t cpu_icount_to_ns(int64_t icount)
{
    // return icount << atomic_read(&timers_state.icount_time_shift);
    // from configure_icount(QemuOpts *opts, Error **errp)
    /* 125MIPS seems a reasonable initial guess at the guest speed.
       It will be corrected fairly quickly anyway.  */
    // timers_state.icount_time_shift = 3;

    return icount << 3;
}